

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3EvalNextRow(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  byte bVar1;
  Fts3Phrase *pFVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  Fts3Expr *in_RDX;
  Fts3Cursor *in_RSI;
  long in_RDI;
  bool bVar6;
  Fts3Phrase *pPhrase;
  Fts3Expr *pRight_2;
  Fts3Expr *pLeft_2;
  sqlite3_int64 iCmp;
  Fts3Expr *pRight_1;
  Fts3Expr *pLeft_1;
  Fts3Doclist *pDl_1;
  Fts3Doclist *pDl;
  sqlite3_int64 iDiff;
  Fts3Expr *pRight;
  Fts3Expr *pLeft;
  int bDescDoclist;
  bool local_85;
  bool local_82;
  u8 *in_stack_ffffffffffffff90;
  Fts3Expr *pFVar7;
  Fts3Phrase *in_stack_ffffffffffffff98;
  sqlite3_stmt *psVar8;
  Fts3Cursor *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (in_RDX->eType == 0) {
    bVar1 = *(byte *)(in_RDI + 0x4c);
    uVar3 = (uint)bVar1;
    *(undefined1 *)((long)&in_RSI->iPrevId + 1) = 1;
    switch(*(undefined4 *)&(in_RSI->base).pVtab) {
    case 1:
    case 3:
      psVar8 = in_RSI->pStmt;
      pFVar7 = in_RSI->pExpr;
      if (psVar8[0x32] == (sqlite3_stmt)0x0) {
        if (pFVar7->bDeferred == '\0') {
          fts3EvalNextRow(in_RSI,in_RDX,(int *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe0));
          fts3EvalNextRow(in_RSI,in_RDX,(int *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
          while( true ) {
            bVar6 = false;
            if ((psVar8[0x30] == (sqlite3_stmt)0x0) && (bVar6 = false, pFVar7->bEof == '\0')) {
              bVar6 = in_RDX->eType == 0;
            }
            if (!bVar6) break;
            iVar4 = 1;
            if (uVar3 != 0) {
              iVar4 = -1;
            }
            lVar5 = (long)iVar4 * (*(long *)(psVar8 + 0x28) - pFVar7->iDocid);
            if (lVar5 == 0) break;
            if (lVar5 < 0) {
              fts3EvalNextRow(in_RSI,in_RDX,(int *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
            }
            else {
              fts3EvalNextRow(in_RSI,in_RDX,(int *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
            }
          }
          in_RSI->pDeferred = *(Fts3DeferredToken **)(psVar8 + 0x28);
          local_82 = true;
          if (psVar8[0x30] == (sqlite3_stmt)0x0) {
            local_82 = pFVar7->bEof != '\0';
          }
          *(bool *)&in_RSI->iPrevId = local_82;
          if ((*(int *)&(in_RSI->base).pVtab == 1) && ((char)in_RSI->iPrevId != '\0')) {
            if ((pFVar7->pPhrase != (Fts3Phrase *)0x0) &&
               ((pFVar7->pPhrase->doclist).aAll != (char *)0x0)) {
              pFVar2 = pFVar7->pPhrase;
              while( true ) {
                bVar6 = false;
                if (in_RDX->eType == 0) {
                  bVar6 = pFVar7->bEof == '\0';
                }
                if (!bVar6) break;
                memset((pFVar2->doclist).pList,0,(long)(pFVar2->doclist).nList);
                fts3EvalNextRow(in_RSI,in_RDX,(int *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
              }
            }
            if ((*(long *)(psVar8 + 0x20) != 0) && (**(long **)(psVar8 + 0x20) != 0)) {
              lVar5 = *(long *)(psVar8 + 0x20);
              while( true ) {
                bVar6 = false;
                if (in_RDX->eType == 0) {
                  bVar6 = psVar8[0x30] == (sqlite3_stmt)0x0;
                }
                if (!bVar6) break;
                memset(*(void **)(lVar5 + 0x28),0,(long)*(int *)(lVar5 + 0x30));
                fts3EvalNextRow(in_RSI,in_RDX,(int *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
              }
            }
          }
        }
        else {
          fts3EvalNextRow(in_RSI,in_RDX,(int *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe0));
          in_RSI->pDeferred = *(Fts3DeferredToken **)(psVar8 + 0x28);
          *(sqlite3_stmt *)&in_RSI->iPrevId = psVar8[0x30];
        }
      }
      else {
        fts3EvalNextRow(in_RSI,in_RDX,(int *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe0));
        in_RSI->pDeferred = (Fts3DeferredToken *)pFVar7->iDocid;
        *(u8 *)&in_RSI->iPrevId = pFVar7->bEof;
      }
      break;
    case 2:
      psVar8 = in_RSI->pStmt;
      pFVar7 = in_RSI->pExpr;
      if (pFVar7->bStart == '\0') {
        fts3EvalNextRow(in_RSI,in_RDX,(int *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe0));
      }
      fts3EvalNextRow(in_RSI,in_RDX,(int *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
      if (psVar8[0x30] == (sqlite3_stmt)0x0) {
        while( true ) {
          bVar6 = false;
          if ((in_RDX->eType == 0) && (bVar6 = false, pFVar7->bEof == '\0')) {
            iVar4 = 1;
            if (uVar3 != 0) {
              iVar4 = -1;
            }
            bVar6 = 0 < (long)iVar4 * (*(long *)(psVar8 + 0x28) - pFVar7->iDocid);
          }
          if (!bVar6) break;
          fts3EvalNextRow(in_RSI,in_RDX,(int *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
        }
      }
      in_RSI->pDeferred = *(Fts3DeferredToken **)(psVar8 + 0x28);
      *(sqlite3_stmt *)&in_RSI->iPrevId = psVar8[0x30];
      break;
    case 4:
      psVar8 = in_RSI->pStmt;
      pFVar7 = in_RSI->pExpr;
      iVar4 = 1;
      if (uVar3 != 0) {
        iVar4 = -1;
      }
      lVar5 = (long)iVar4 * (*(long *)(psVar8 + 0x28) - pFVar7->iDocid);
      if ((pFVar7->bEof == '\0') && ((psVar8[0x30] != (sqlite3_stmt)0x0 || (-1 < lVar5)))) {
        if ((psVar8[0x30] == (sqlite3_stmt)0x0) && ((pFVar7->bEof != '\0' || (lVar5 < 1)))) {
          fts3EvalNextRow(in_RSI,in_RDX,(int *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe0));
          fts3EvalNextRow(in_RSI,in_RDX,(int *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
        }
        else {
          fts3EvalNextRow(in_RSI,in_RDX,(int *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe0));
        }
      }
      else {
        fts3EvalNextRow(in_RSI,in_RDX,(int *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe0));
      }
      local_85 = false;
      if (psVar8[0x30] != (sqlite3_stmt)0x0) {
        local_85 = pFVar7->bEof != '\0';
      }
      *(bool *)&in_RSI->iPrevId = local_85;
      iVar4 = 1;
      if (uVar3 != 0) {
        iVar4 = -1;
      }
      if ((pFVar7->bEof == '\0') &&
         ((psVar8[0x30] != (sqlite3_stmt)0x0 ||
          (-1 < (long)iVar4 * (*(long *)(psVar8 + 0x28) - pFVar7->iDocid))))) {
        in_RSI->pDeferred = (Fts3DeferredToken *)pFVar7->iDocid;
      }
      else {
        in_RSI->pDeferred = *(Fts3DeferredToken **)(psVar8 + 0x28);
      }
      break;
    default:
      lVar5 = *(long *)&in_RSI->iLangid;
      fts3EvalInvalidatePoslist((Fts3Phrase *)0x1c382a);
      iVar4 = fts3EvalPhraseNext(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                                 in_stack_ffffffffffffff90);
      in_RDX->eType = iVar4;
      in_RSI->pDeferred = *(Fts3DeferredToken **)(lVar5 + 0x18);
    }
  }
  return;
}

Assistant:

static void fts3EvalNextRow(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pExpr,                /* Expr. to advance to next matching row */
  int *pRc                        /* IN/OUT: Error code */
){
  if( *pRc==SQLITE_OK ){
    int bDescDoclist = pCsr->bDesc;         /* Used by DOCID_CMP() macro */
    assert( pExpr->bEof==0 );
    pExpr->bStart = 1;

    switch( pExpr->eType ){
      case FTSQUERY_NEAR:
      case FTSQUERY_AND: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;
        assert( !pLeft->bDeferred || !pRight->bDeferred );

        if( pLeft->bDeferred ){
          /* LHS is entirely deferred. So we assume it matches every row.
          ** Advance the RHS iterator to find the next row visited. */
          fts3EvalNextRow(pCsr, pRight, pRc);
          pExpr->iDocid = pRight->iDocid;
          pExpr->bEof = pRight->bEof;
        }else if( pRight->bDeferred ){
          /* RHS is entirely deferred. So we assume it matches every row.
          ** Advance the LHS iterator to find the next row visited. */
          fts3EvalNextRow(pCsr, pLeft, pRc);
          pExpr->iDocid = pLeft->iDocid;
          pExpr->bEof = pLeft->bEof;
        }else{
          /* Neither the RHS or LHS are deferred. */
          fts3EvalNextRow(pCsr, pLeft, pRc);
          fts3EvalNextRow(pCsr, pRight, pRc);
          while( !pLeft->bEof && !pRight->bEof && *pRc==SQLITE_OK ){
            sqlite3_int64 iDiff = DOCID_CMP(pLeft->iDocid, pRight->iDocid);
            if( iDiff==0 ) break;
            if( iDiff<0 ){
              fts3EvalNextRow(pCsr, pLeft, pRc);
            }else{
              fts3EvalNextRow(pCsr, pRight, pRc);
            }
          }
          pExpr->iDocid = pLeft->iDocid;
          pExpr->bEof = (pLeft->bEof || pRight->bEof);
          if( pExpr->eType==FTSQUERY_NEAR && pExpr->bEof ){
            if( pRight->pPhrase && pRight->pPhrase->doclist.aAll ){
              Fts3Doclist *pDl = &pRight->pPhrase->doclist;
              while( *pRc==SQLITE_OK && pRight->bEof==0 ){
                memset(pDl->pList, 0, pDl->nList);
                fts3EvalNextRow(pCsr, pRight, pRc);
              }
            }
            if( pLeft->pPhrase && pLeft->pPhrase->doclist.aAll ){
              Fts3Doclist *pDl = &pLeft->pPhrase->doclist;
              while( *pRc==SQLITE_OK && pLeft->bEof==0 ){
                memset(pDl->pList, 0, pDl->nList);
                fts3EvalNextRow(pCsr, pLeft, pRc);
              }
            }
          }
        }
        break;
      }
  
      case FTSQUERY_OR: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;
        sqlite3_int64 iCmp = DOCID_CMP(pLeft->iDocid, pRight->iDocid);

        assert( pLeft->bStart || pLeft->iDocid==pRight->iDocid );
        assert( pRight->bStart || pLeft->iDocid==pRight->iDocid );

        if( pRight->bEof || (pLeft->bEof==0 && iCmp<0) ){
          fts3EvalNextRow(pCsr, pLeft, pRc);
        }else if( pLeft->bEof || (pRight->bEof==0 && iCmp>0) ){
          fts3EvalNextRow(pCsr, pRight, pRc);
        }else{
          fts3EvalNextRow(pCsr, pLeft, pRc);
          fts3EvalNextRow(pCsr, pRight, pRc);
        }

        pExpr->bEof = (pLeft->bEof && pRight->bEof);
        iCmp = DOCID_CMP(pLeft->iDocid, pRight->iDocid);
        if( pRight->bEof || (pLeft->bEof==0 &&  iCmp<0) ){
          pExpr->iDocid = pLeft->iDocid;
        }else{
          pExpr->iDocid = pRight->iDocid;
        }

        break;
      }

      case FTSQUERY_NOT: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;

        if( pRight->bStart==0 ){
          fts3EvalNextRow(pCsr, pRight, pRc);
          assert( *pRc!=SQLITE_OK || pRight->bStart );
        }

        fts3EvalNextRow(pCsr, pLeft, pRc);
        if( pLeft->bEof==0 ){
          while( !*pRc 
              && !pRight->bEof 
              && DOCID_CMP(pLeft->iDocid, pRight->iDocid)>0 
          ){
            fts3EvalNextRow(pCsr, pRight, pRc);
          }
        }
        pExpr->iDocid = pLeft->iDocid;
        pExpr->bEof = pLeft->bEof;
        break;
      }

      default: {
        Fts3Phrase *pPhrase = pExpr->pPhrase;
        fts3EvalInvalidatePoslist(pPhrase);
        *pRc = fts3EvalPhraseNext(pCsr, pPhrase, &pExpr->bEof);
        pExpr->iDocid = pPhrase->doclist.iDocid;
        break;
      }
    }
  }
}